

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  uint7 uVar6;
  size_t sVar3;
  ostream *poVar4;
  char *pcVar5;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  char local_4d;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  ulong local_38;
  
  if (argc < 2) {
    usageMessage((ostream *)&std::cerr,*argv,false);
    uVar2 = 1;
  }
  else {
    bVar8 = true;
    local_3c = 0;
    local_44 = 0;
    local_4c = 0;
    local_48 = 0;
    local_40 = 0;
    uVar7 = 2;
    local_38 = (ulong)(uint)argc;
    do {
      pcVar5 = argv[uVar7 - 1];
      if (*pcVar5 != '-') {
        iVar1 = strcmp(pcVar5,"--help");
        if (iVar1 == 0) goto LAB_001028b5;
LAB_00102781:
        iVar1 = strcmp(pcVar5,"--version");
        if (iVar1 == 0) {
          pcVar5 = (char *)Imf_3_4::getLibraryVersion();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"exrcheck (OpenEXR) ",0x13);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"3.4.0",5);
          iVar1 = strcmp(pcVar5,"3.4.0");
          if (iVar1 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"(OpenEXR version ",0x11);
            poVar4 = std::operator<<((ostream *)&std::cout,pcVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout," https://openexr.com",0x14);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
          std::ostream::put(-0x70);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Copyright (c) Contributors to the OpenEXR Project",0x31)
          ;
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
          std::ostream::put(-0x70);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"License BSD-3-Clause",0x14);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
          std::ostream::put(-0x70);
          std::ostream::flush();
LAB_00102a06:
          if (bVar8) {
            return 0;
          }
        }
        else {
          iVar1 = access(pcVar5,4);
          if (iVar1 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," file ",6);
            pcVar5 = argv[uVar7 - 1];
            if (pcVar5 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x106090);
            }
            else {
              sVar3 = strlen(pcVar5);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar3)
              ;
            }
            local_4d = ' ';
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_4d,1);
            std::ostream::flush();
            bVar8 = exrCheck(argv[uVar7 - 1],(bool)((byte)local_3c & 1),(bool)((byte)local_40 & 1),
                             (bool)((byte)local_44 & 1),(bool)((byte)local_48 & 1));
            if (bVar8) {
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,"bad\n",4);
              local_4c = (undefined4)CONCAT71((int7)((ulong)poVar4 >> 8),1);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OK\n",3);
            }
            goto LAB_00102893;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"No such file: ",0xe);
          pcVar5 = argv[uVar7 - 1];
          if (pcVar5 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x106100);
          }
          else {
            sVar3 = strlen(pcVar5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,sVar3);
          }
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
          std::ostream::put('\0');
          std::ostream::flush();
          if (bVar8) {
            return -1;
          }
        }
        break;
      }
      if (((pcVar5[1] == 'h') && (pcVar5[2] == '\0')) ||
         (iVar1 = strcmp(pcVar5,"--help"), iVar1 == 0)) {
LAB_001028b5:
        usageMessage((ostream *)&std::cout,"exrcheck",true);
        goto LAB_00102a06;
      }
      uVar6 = (uint7)(uint3)((uint)iVar1 >> 8);
      if ((pcVar5[1] == 'm') && (pcVar5[2] == '\0')) {
        local_3c = (undefined4)CONCAT71(uVar6,1);
      }
      else if ((pcVar5[1] == 't') && (pcVar5[2] == '\0')) {
        local_40 = (undefined4)CONCAT71(uVar6,1);
      }
      else if ((pcVar5[1] == 's') && (pcVar5[2] == '\0')) {
        local_44 = (undefined4)CONCAT71(uVar6,1);
      }
      else {
        if ((pcVar5[1] != 'c') || (pcVar5[2] != '\0')) goto LAB_00102781;
        local_48 = (undefined4)CONCAT71(uVar6,1);
      }
LAB_00102893:
      bVar8 = uVar7 < local_38;
      bVar9 = uVar7 != (uint)argc;
      uVar7 = uVar7 + 1;
    } while (bVar9);
    uVar2 = (uint)((byte)local_4c & 1);
  }
  return uVar2;
}

Assistant:

int
main (int argc, char** argv)
{
    if (argc < 2)
    {
        usageMessage (cerr, argv[0], false);
        return 1;
    }

    bool reduceMemory    = false;
    bool reduceTime      = false;
    bool enableCoreCheck = false;
    bool badFileFound    = false;
    bool useStream       = false;
    for (int i = 1; i < argc; ++i)
    {
        if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))
        {
            usageMessage (cout, "exrcheck", true);
            return 0;
        }
        else if (!strcmp (argv[i], "-m"))
        {
            //
            // note for further memory reduction, calls to the following could be added here
            // CompositeDeepScanLine::setMaximumSampleCount();
            // Header::setMaxImageSize();
            // Header::setMaxTileSize();

            reduceMemory = true;
        }
        else if (!strcmp (argv[i], "-t")) { reduceTime = true; }
        else if (!strcmp (argv[i], "-s")) { useStream = true; }
        else if (!strcmp (argv[i], "-c")) { enableCoreCheck = true; }
        else if (!strcmp (argv[i], "--version"))
        {
            const char* libraryVersion = getLibraryVersion ();

            cout << "exrcheck (OpenEXR) " << OPENEXR_VERSION_STRING;
            if (strcmp (libraryVersion, OPENEXR_VERSION_STRING))
                cout << "(OpenEXR version " << libraryVersion << ")";
            cout << " https://openexr.com" << endl;
            cout << "Copyright (c) Contributors to the OpenEXR Project" << endl;
            cout << "License BSD-3-Clause" << endl;

            return 0;
        }
        else
        {

#if defined _WIN32 || defined _WIN64
            if (_access (argv[i], 4) != 0)
#else
            if (access (argv[i], R_OK) != 0)
#endif
            {
                cerr << "No such file: " << argv[i] << endl;
                return -1;
            }

            cout << " file " << argv[i] << ' ';
            cout.flush ();

            bool hasError = exrCheck (
                argv[i], reduceMemory, reduceTime, useStream, enableCoreCheck);
            if (hasError)
            {
                cout << "bad\n";
                badFileFound = true;
            }
            else { cout << "OK\n"; }
        }
    }

    return badFileFound;
}